

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O2

void beltHashStepH(void *buf,size_t count,void *state)

{
  void *dest;
  long lVar1;
  
  beltBlockAddBitSizeU32((u32 *)state,count);
  lVar1 = *(long *)((long)state + 0x90);
  if (lVar1 != 0) {
    dest = (void *)((long)state + lVar1 + 0x70);
    if (count < 0x20U - lVar1) {
      memCopy(dest,buf,count);
      *(long *)((long)state + 0x90) = *(long *)((long)state + 0x90) + count;
      return;
    }
    memCopy(dest,buf,0x20U - lVar1);
    lVar1 = 0x20 - *(long *)((long)state + 0x90);
    count = count - lVar1;
    buf = (void *)((long)buf + lVar1);
    beltCompr2((u32 *)((long)state + 0x10),(u32 *)((long)state + 0x30),(u32 *)((long)state + 0x70),
               (void *)((long)state + 0x98));
    *(undefined8 *)((long)state + 0x90) = 0;
  }
  for (; 0x1f < count; count = count - 0x20) {
    *(undefined8 *)((long)state + 0x70) = *buf;
    *(undefined8 *)((long)state + 0x78) = *(undefined8 *)((long)buf + 8);
    *(undefined8 *)((long)state + 0x80) = *(undefined8 *)((long)buf + 0x10);
    *(undefined8 *)((long)state + 0x88) = *(undefined8 *)((long)buf + 0x18);
    beltCompr2((u32 *)((long)state + 0x10),(u32 *)((long)state + 0x30),(u32 *)((long)state + 0x70),
               (void *)((long)state + 0x98));
    buf = (void *)((long)buf + 0x20);
  }
  if (count == 0) {
    return;
  }
  *(size_t *)((long)state + 0x90) = count;
  memCopy((u32 *)((long)state + 0x70),buf,count);
  return;
}

Assistant:

void beltHashStepH(const void* buf, size_t count, void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltHash_keep()));
	// обновить длину
	beltBlockAddBitSizeU32(st->ls, count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 32 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 32 - st->filled);
		count -= 32 - st->filled;
		buf = (const octet*)buf + (32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h, (u32*)st->block, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		beltBlockCopy(st->block, buf);
		beltBlockCopy(st->block + 16, (const octet*)buf + 16);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h, (u32*)st->block, st->stack);
		buf = (const octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}